

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::UpdateWitnessStackRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::UpdateWitnessStackRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  string *psVar3;
  undefined8 uVar4;
  CfdException ex;
  RawTransactionResponse res;
  UpdateWitnessStackRequestStruct request;
  UpdateWitnessStackRequest req;
  undefined1 local_4a8 [40];
  _Alloc_hider local_480;
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_460;
  size_type local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_410;
  string local_3e0;
  undefined1 local_3c0 [16];
  undefined *local_3b0 [2];
  int local_3a0;
  _Alloc_hider local_398;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  char local_368 [16];
  undefined1 local_358 [48];
  undefined1 auStack_328 [32];
  _Base_ptr p_Stack_308;
  size_t local_300;
  UpdateWitnessStackRequestStruct local_2f8;
  UpdateWitnessStackRequest local_1a0;
  
  UpdateWitnessStackRequest::UpdateWitnessStackRequest(&local_1a0);
  core::JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>::Deserialize
            (&local_1a0.super_JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>,
             (string *)this);
  UpdateWitnessStackRequest::ConvertToStruct(&local_2f8,&local_1a0);
  local_4a8._0_8_ = local_4a8 + 0x10;
  local_4a8._8_8_ = 0;
  local_4a8[0x10] = '\0';
  local_4a8._32_4_ = 0;
  local_480._M_p = (pointer)&local_470;
  local_478 = 0;
  local_470._M_local_buf[0] = '\0';
  local_460._M_p = (pointer)&local_450;
  local_458 = 0;
  local_450._M_local_buf[0] = '\0';
  p_Var1 = &local_440._M_impl.super__Rb_tree_header;
  local_440._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_440._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_440._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_410._M_impl.super__Rb_tree_header;
  local_410._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_410._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_410._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_440._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_440._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_410._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_410._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_2f8.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005f4094:
      uVar4 = std::__throw_bad_function_call();
      RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_3c0);
      psVar3 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p;
      if (psVar3 != (string *)&local_480) {
        operator_delete(psVar3);
      }
      RawTransactionResponseStruct::~RawTransactionResponseStruct
                ((RawTransactionResponseStruct *)local_4a8);
      UpdateWitnessStackRequestStruct::~UpdateWitnessStackRequestStruct(&local_2f8);
      UpdateWitnessStackRequest::~UpdateWitnessStackRequest(&local_1a0);
      _Unwind_Resume(uVar4);
    }
    (*bitcoin_function->_M_invoker)
              ((RawTransactionResponseStruct *)local_3c0,(_Any_data *)bitcoin_function,&local_2f8);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f4094;
    (**(code **)((long)&request_message->field_2 + 8))(local_3c0,request_message,&local_2f8);
  }
  std::__cxx11::string::operator=((string *)local_4a8,(string *)local_3c0);
  local_4a8._32_4_ = local_3a0;
  std::__cxx11::string::operator=((string *)&local_480,(string *)&local_398);
  std::__cxx11::string::operator=((string *)&local_460,(string *)(local_388 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_440);
  if ((_Base_ptr)local_358._16_8_ != (_Base_ptr)0x0) {
    local_440._M_impl.super__Rb_tree_header._M_header._M_color = local_358._8_4_;
    local_440._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_358._16_8_;
    local_440._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_358._24_8_;
    local_440._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_358._32_8_;
    *(_Rb_tree_header **)(local_358._16_8_ + 8) = p_Var1;
    local_440._M_impl.super__Rb_tree_header._M_node_count = local_358._40_8_;
    local_358._16_8_ = (_Base_ptr)0x0;
    local_358._40_8_ = 0;
    local_358._24_8_ = (_Base_ptr)(local_358 + 8);
    local_358._32_8_ = (_Base_ptr)(local_358 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_410);
  if ((_Base_ptr)auStack_328._16_8_ != (_Base_ptr)0x0) {
    local_410._M_impl.super__Rb_tree_header._M_header._M_color = auStack_328._8_4_;
    local_410._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)auStack_328._16_8_;
    local_410._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)auStack_328._24_8_;
    local_410._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_308;
    *(_Rb_tree_header **)(auStack_328._16_8_ + 8) = p_Var2;
    local_410._M_impl.super__Rb_tree_header._M_node_count = local_300;
    auStack_328._16_8_ = (_Base_ptr)0x0;
    local_300 = 0;
    auStack_328._24_8_ = (_Base_ptr)(auStack_328 + 8);
    p_Stack_308 = (_Base_ptr)(auStack_328 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_328);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_358);
  if ((char *)local_378._M_allocated_capacity != local_368) {
    operator_delete((void *)local_378._M_allocated_capacity);
  }
  if (local_398._M_p != local_388) {
    operator_delete(local_398._M_p);
  }
  if ((undefined1 *)local_3c0._0_8_ != local_3c0 + 0x10) {
    operator_delete((void *)local_3c0._0_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_4a8._32_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_3c0);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_3c0,(RawTransactionResponseStruct *)local_4a8);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_
              (&local_3e0,(JsonClassBase<cfd::js::api::json::RawTransactionResponse> *)local_3c0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_3c0);
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_3c0,(InnerErrorResponseStruct *)(local_4a8 + 0x20));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_3e0,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_3c0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p);
    }
    local_3c0._0_8_ = &PTR__ErrorResponseBase_00a78a38;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_388);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3c0 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_410);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_p != &local_450) {
    operator_delete(local_460._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_p != &local_470) {
    operator_delete(local_480._M_p);
  }
  if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
    operator_delete((void *)local_4a8._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2f8.ignore_items._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2f8.txin.ignore_items._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2f8.txin.witness_stack.ignore_items._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.txin.witness_stack.sighash_type._M_dataplus._M_p !=
      &local_2f8.txin.witness_stack.sighash_type.field_2) {
    operator_delete(local_2f8.txin.witness_stack.sighash_type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.txin.witness_stack.type._M_dataplus._M_p !=
      &local_2f8.txin.witness_stack.type.field_2) {
    operator_delete(local_2f8.txin.witness_stack.type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.txin.witness_stack.hex._M_dataplus._M_p !=
      &local_2f8.txin.witness_stack.hex.field_2) {
    operator_delete(local_2f8.txin.witness_stack.hex._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.txin.txid._M_dataplus._M_p != &local_2f8.txin.txid.field_2) {
    operator_delete(local_2f8.txin.txid._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.tx._M_dataplus._M_p != &local_2f8.tx.field_2) {
    operator_delete(local_2f8.tx._M_dataplus._M_p);
  }
  UpdateWitnessStackRequest::~UpdateWitnessStackRequest(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}